

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

AddSocketOptionFunc *
brynet::net::TcpService::AddSocketOption::WithServerSideSSL
          (AddSocketOptionFunc *__return_storage_ptr__,PTR *sslHelper)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *puVar2;
  __shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &sslHelper->super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar2 = (undefined8 *)operator_new(0x10);
  _Var1._M_pi = local_28._M_refcount._M_pi;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *puVar2 = local_28._M_ptr;
  puVar2[1] = _Var1._M_pi;
  local_28._M_ptr = (element_type *)0x0;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(brynet::net::TcpService::AddSocketOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:604:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(brynet::net::TcpService::AddSocketOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:604:12)>
       ::_M_manager;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

TcpService::AddSocketOption::AddSocketOptionFunc TcpService::AddSocketOption::WithServerSideSSL(SSLHelper::PTR sslHelper)
{
    return [=](TcpService::AddSocketOption::Options& option) {
        option.sslHelper = sslHelper;
        option.useSSL = true;
    };
}